

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::SparseSupportVectors::ByteSizeLong(SparseSupportVectors *this)

{
  uint uVar1;
  Type *value;
  size_t sVar2;
  uint i;
  uint index;
  ulong uVar3;
  
  uVar1 = (this->vectors_).super_RepeatedPtrFieldBase.current_size_;
  uVar3 = (ulong)uVar1;
  for (index = 0; uVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SparseVector>::TypeHandler>
                      (&(this->vectors_).super_RepeatedPtrFieldBase,index);
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SparseVector>(value);
    uVar3 = uVar3 + sVar2;
  }
  this->_cached_size_ = (int)uVar3;
  return uVar3;
}

Assistant:

size_t SparseSupportVectors::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SparseSupportVectors)
  size_t total_size = 0;

  // repeated .CoreML.Specification.SparseVector vectors = 1;
  {
    unsigned int count = this->vectors_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->vectors(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}